

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O2

void __thiscall ON_wString::TrimRight(ON_wString *this,wchar_t *s)

{
  wchar_t wVar1;
  int iVar2;
  wchar_t *pwVar3;
  ON_Internal_Empty_wString *pOVar4;
  ulong uVar5;
  wchar_t *pwVar6;
  ulong uVar7;
  
  pwVar3 = this->m_s;
  pOVar4 = (ON_Internal_Empty_wString *)(pwVar3 + -3);
  if (pwVar3 == (wchar_t *)0x0) {
    pOVar4 = &empty_wstring;
  }
  uVar5 = (ulong)(pOVar4->header).string_length;
  if (0 < (long)uVar5) {
    if (s == (wchar_t *)0x0) {
      do {
        uVar7 = uVar5;
        if ((long)uVar7 < 1) goto LAB_0066f5bf;
        pwVar3 = this->m_s;
        if (pwVar3[uVar7 - 1] < L'\x01') goto LAB_0066f5d5;
        iVar2 = ON_IsUnicodeSpaceOrControlCodePoint(pwVar3[uVar7 - 1]);
        uVar5 = uVar7 - 1;
      } while (iVar2 != 0);
      pwVar3 = this->m_s;
    }
    else {
      do {
        uVar7 = uVar5;
        if ((long)uVar7 < 1) {
LAB_0066f5bf:
          Destroy(this);
          return;
        }
        pwVar6 = s;
        if (pwVar3[uVar7 - 1] == L'\0') break;
        do {
          wVar1 = *pwVar6;
          if (wVar1 == L'\0') break;
          pwVar6 = pwVar6 + 1;
        } while (wVar1 != pwVar3[uVar7 - 1]);
        uVar5 = uVar7 - 1;
      } while (wVar1 != L'\0');
    }
LAB_0066f5d5:
    if (pwVar3[uVar7 & 0xffffffff] != L'\0') {
      CopyArray(this);
      pwVar3 = this->m_s;
      pwVar3[uVar7 & 0xffffffff] = L'\0';
      pOVar4 = (ON_Internal_Empty_wString *)(pwVar3 + -3);
      if (pwVar3 == (wchar_t *)0x0) {
        pOVar4 = &empty_wstring;
      }
      (pOVar4->header).string_length = (int)uVar7;
    }
  }
  return;
}

Assistant:

ON_wStringHeader* ON_wString::Header() const
{
  ON_wStringHeader* hdr = (ON_wStringHeader*)m_s;
  if (hdr)
    hdr--;
  else
    hdr = &empty_wstring.header;
  return hdr;
}